

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

QDebug __thiscall QMessageLogger::info(QMessageLogger *this,QLoggingCategory *cat)

{
  long lVar1;
  long in_RDX;
  
  *(undefined1 **)&this->context = &DAT_aaaaaaaaaaaaaaaa;
  QDebug::QDebug((QDebug *)this,QtInfoMsg);
  if ((*(byte *)(in_RDX + 0x13) & 1) == 0) {
    *(undefined1 *)(*(long *)&this->context + 0x32) = 0;
  }
  lVar1 = *(long *)&this->context;
  QMessageLogContext::copyContextFrom
            ((QMessageLogContext *)(lVar1 + 0x38),(QMessageLogContext *)cat);
  *(undefined8 *)(lVar1 + 0x50) = *(undefined8 *)(in_RDX + 8);
  return (QDebug)(Stream *)this;
}

Assistant:

QDebug QMessageLogger::info(const QLoggingCategory &cat) const
{
    QDebug dbg = QDebug(QtInfoMsg);
    if (!cat.isInfoEnabled())
        dbg.stream->message_output = false;

    QMessageLogContext &ctxt = dbg.stream->context;
    ctxt.copyContextFrom(context);
    ctxt.category = cat.categoryName();

    return dbg;
}